

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O3

void Fl::focus(Fl_Widget *o)

{
  Fl_X *pFVar1;
  Fl_Group *pFVar2;
  int iVar3;
  undefined4 extraout_var;
  Fl_Window *pFVar4;
  Fl_Window *this;
  Fl_Group *pFVar5;
  
  pFVar2 = (Fl_Group *)focus_;
  iVar3 = e_number;
  if ((((o == (Fl_Widget *)0x0) || ((o->flags_ & 0x200) != 0)) && (grab_ == (Fl_Window *)0x0)) &&
     (focus_ != o)) {
    compose_reset();
    focus_ = o;
    this = fl_xfocus;
    if (o != (Fl_Widget *)0x0) {
      iVar3 = (*o->_vptr_Fl_Widget[8])(o);
      pFVar4 = (Fl_Window *)CONCAT44(extraout_var,iVar3);
      if (((Fl_Window *)CONCAT44(extraout_var,iVar3) != (Fl_Window *)0x0) ||
         (pFVar4 = Fl_Widget::window(o), this = fl_xfocus, pFVar4 != (Fl_Window *)0x0)) {
        do {
          this = pFVar4;
          pFVar4 = Fl_Widget::window((Fl_Widget *)this);
        } while (pFVar4 != (Fl_Window *)0x0);
        if (fl_xfocus != this) {
          pFVar1 = this->i;
          iVar3 = Fl_X::ewmh_supported();
          if (iVar3 == 0) {
            (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])(this);
          }
          else if (pFVar1 != (Fl_X *)0x0) {
            Fl_X::activate_window(pFVar1->xid);
          }
        }
      }
    }
    fl_xfocus = this;
    iVar3 = e_number;
    fl_oldfocus = (Fl_Widget *)0x0;
    e_number = 7;
    while (pFVar5 = pFVar2, pFVar5 != (Fl_Group *)0x0) {
      (*(pFVar5->super_Fl_Widget)._vptr_Fl_Widget[3])(pFVar5,7);
      pFVar2 = (pFVar5->super_Fl_Widget).parent_;
      fl_oldfocus = &pFVar5->super_Fl_Widget;
    }
  }
  e_number = iVar3;
  return;
}

Assistant:

void Fl::focus(Fl_Widget *o) {
  if (o && !o->visible_focus()) return;
  if (grab()) return; // don't do anything while grab is on
  Fl_Widget *p = focus_;
  if (o != p) {
    Fl::compose_reset();
    focus_ = o;
    // make sure that fl_xfocus is set to the top level window
    // of this widget, or fl_fix_focus will clear our focus again
    if (o) {
      Fl_Window *win = 0, *w1 = o->as_window();
      if (!w1) w1 = o->window();
      while (w1) { win=w1; w1=win->window(); }
      if (win) {
#ifdef __APPLE__
	if (fl_xfocus != win) {
	  Fl_X *x = Fl_X::i(win);
	  if (x) x->set_key_window();
	}
#elif defined(USE_X11)
	if (fl_xfocus != win) {
	  Fl_X *x = Fl_X::i(win);
	  if (!Fl_X::ewmh_supported())
	    win->show(); // Old WMs, XMapRaised
	  else if (x) // New WMs use the NETWM attribute:
	    Fl_X::activate_window(x->xid);
	}
#endif
	fl_xfocus = win;
      }
    }
    // take focus from the old focused window
    fl_oldfocus = 0;
    int old_event = e_number;
    e_number = FL_UNFOCUS;
    for (; p; p = p->parent()) {
      p->handle(FL_UNFOCUS);
      fl_oldfocus = p;
    }
    e_number = old_event;
  }
}